

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_complex_op.hpp
# Opt level: O2

quaternion<double> * HAXX::operator*(complex<double> *__x,quaternion<double> *__y)

{
  undefined8 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  quaternion<double> *in_RDI;
  undefined1 auVar4 [16];
  quaternion<double> qVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(__x->_M_value + 8);
  qVar5 = *__y;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar4 = vxorpd_avx512vl(auVar6,auVar4);
  auVar4 = vunpcklpd_avx(auVar4,auVar6);
  auVar2 = vshufpd_avx((undefined1  [32])qVar5,(undefined1  [32])qVar5,5);
  auVar3 = vpermpd_avx2(ZEXT1632(auVar4),0x44);
  auVar7._0_8_ = auVar3._0_8_ * auVar2._0_8_;
  auVar7._8_8_ = auVar3._8_8_ * auVar2._8_8_;
  auVar7._16_8_ = auVar3._16_8_ * auVar2._16_8_;
  auVar7._24_8_ = auVar3._24_8_ * auVar2._24_8_;
  uVar1 = *(undefined8 *)__x->_M_value;
  auVar2._8_8_ = uVar1;
  auVar2._0_8_ = uVar1;
  auVar2._16_8_ = uVar1;
  auVar2._24_8_ = uVar1;
  qVar5 = (quaternion<double>)vfmadd231pd_avx512vl(auVar7,(undefined1  [32])qVar5,auVar2);
  *in_RDI = qVar5;
  return in_RDI;
}

Assistant:

inline quaternion<_F> operator*(const std::complex<_F>& __x,
  const quaternion<_F>& __y) {

  quaternion<_F> __r;

  // This is a really naive algorithm
  __r.real(__x.real()   * __y.real()   - __x.imag() * __y.imag_i());
  __r.imag_i(__x.real() * __y.imag_i() + __x.imag() * __y.real());
  __r.imag_j(__x.real() * __y.imag_j() - __x.imag() * __y.imag_k());
  __r.imag_k(__x.real() * __y.imag_k() + __x.imag() * __y.imag_j());
  
  return __r;

}